

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O3

void __thiscall
jrtplib::RTCPCompoundPacketBuilder::~RTCPCompoundPacketBuilder(RTCPCompoundPacketBuilder *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPCompoundPacketBuilder_00142d00;
  if (this->external == true) {
    (this->super_RTCPCompoundPacket).compoundpacket = (uint8_t *)0x0;
  }
  ClearBuildBuffers(this);
  p_Var2 = (this->apppackets).
           super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->apppackets) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var1;
  }
  p_Var2 = (this->byepackets).
           super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->byepackets) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var1;
  }
  SDES::~SDES(&this->sdes);
  Report::~Report(&this->report);
  RTCPCompoundPacket::~RTCPCompoundPacket(&this->super_RTCPCompoundPacket);
  return;
}

Assistant:

RTCPCompoundPacketBuilder::~RTCPCompoundPacketBuilder()
{
	if (external)
		compoundpacket = 0; // make sure RTCPCompoundPacket doesn't delete the external buffer
	ClearBuildBuffers();
}